

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool __thiscall cppcms::xss::uri_parser::relative_ref(uri_parser *this)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  
  bVar1 = relative_part(this);
  if (bVar1) {
    pcVar3 = this->begin_;
    if ((pcVar3 != this->end_) && (*pcVar3 == '?')) {
      this->begin_ = pcVar3 + 1;
      bVar2 = query(this);
      if (bVar2) {
        pcVar3 = this->begin_;
      }
    }
    this->begin_ = pcVar3;
    if ((pcVar3 != this->end_) && (*pcVar3 == '#')) {
      this->begin_ = pcVar3 + 1;
      bVar2 = query(this);
      if (bVar2) {
        pcVar3 = this->begin_;
      }
    }
    this->begin_ = pcVar3;
  }
  return bVar1;
}

Assistant:

bool relative_ref()
		{
			if(!relative_part())
				return false;

			{
				save_point sp2(this);
				if(follows('?') && query())
					sp2.commit();
			}

			{
				save_point sp2(this);
				if(follows('#') && fragment())
					sp2.commit();
			}
			return true;
		}